

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::FindManufacturer
          (SystemInformationImplementation *this,string *family)

{
  string *__lhs;
  bool bVar1;
  Manufacturer MVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = &(this->ChipID).Vendor;
  bVar1 = std::operator==(__lhs,"GenuineIntel");
  if (bVar1) {
    MVar2 = Intel;
  }
  else {
    bVar1 = std::operator==(__lhs,"UMC UMC UMC ");
    if (bVar1) {
      MVar2 = UMC;
    }
    else {
      bVar1 = std::operator==(__lhs,"AuthenticAMD");
      MVar2 = AMD;
      if ((!bVar1) && (bVar1 = std::operator==(__lhs,"AMD ISBETTER"), !bVar1)) {
        bVar1 = std::operator==(__lhs,"CyrixInstead");
        if (bVar1) {
          MVar2 = Cyrix;
        }
        else {
          bVar1 = std::operator==(__lhs,"NexGenDriven");
          if (bVar1) {
            MVar2 = NexGen;
          }
          else {
            bVar1 = std::operator==(__lhs,"CentaurHauls");
            if (bVar1) {
              MVar2 = IDT;
            }
            else {
              bVar1 = std::operator==(__lhs,"RiseRiseRise");
              if (bVar1) {
                MVar2 = Rise;
              }
              else {
                bVar1 = std::operator==(__lhs,"GenuineTMx86");
                MVar2 = Transmeta;
                if ((!bVar1) && (bVar1 = std::operator==(__lhs,"TransmetaCPU"), !bVar1)) {
                  bVar1 = std::operator==(__lhs,"Geode By NSC");
                  if (bVar1) {
                    MVar2 = NSC;
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"Sun");
                    if (bVar1) {
                      MVar2 = Sun;
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"IBM");
                      if (bVar1) {
                        MVar2 = IBM;
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"Hewlett-Packard");
                        if (bVar1) {
                          MVar2 = HP;
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"Motorola");
                          if (bVar1) {
                            MVar2 = Motorola;
                          }
                          else {
                            std::__cxx11::string::substr((ulong)&local_40,(ulong)family);
                            bVar1 = std::operator==(&local_40,"PA-RISC");
                            std::__cxx11::string::~string((string *)&local_40);
                            MVar2 = bVar1 ^ UnknownManufacturer;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->ChipManufacturer = MVar2;
  return;
}

Assistant:

void SystemInformationImplementation::FindManufacturer(
  const std::string& family)
{
  if (this->ChipID.Vendor == "GenuineIntel")
    this->ChipManufacturer = Intel; // Intel Corp.
  else if (this->ChipID.Vendor == "UMC UMC UMC ")
    this->ChipManufacturer = UMC; // United Microelectronics Corp.
  else if (this->ChipID.Vendor == "AuthenticAMD")
    this->ChipManufacturer = AMD; // Advanced Micro Devices
  else if (this->ChipID.Vendor == "AMD ISBETTER")
    this->ChipManufacturer = AMD; // Advanced Micro Devices (1994)
  else if (this->ChipID.Vendor == "CyrixInstead")
    this->ChipManufacturer = Cyrix; // Cyrix Corp., VIA Inc.
  else if (this->ChipID.Vendor == "NexGenDriven")
    this->ChipManufacturer = NexGen; // NexGen Inc. (now AMD)
  else if (this->ChipID.Vendor == "CentaurHauls")
    this->ChipManufacturer = IDT; // IDT/Centaur (now VIA)
  else if (this->ChipID.Vendor == "RiseRiseRise")
    this->ChipManufacturer = Rise; // Rise
  else if (this->ChipID.Vendor == "GenuineTMx86")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "TransmetaCPU")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "Geode By NSC")
    this->ChipManufacturer = NSC; // National Semiconductor
  else if (this->ChipID.Vendor == "Sun")
    this->ChipManufacturer = Sun; // Sun Microelectronics
  else if (this->ChipID.Vendor == "IBM")
    this->ChipManufacturer = IBM; // IBM Microelectronics
  else if (this->ChipID.Vendor == "Hewlett-Packard")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Motorola")
    this->ChipManufacturer = Motorola; // Motorola Microelectronics
  else if (family.substr(0, 7) == "PA-RISC")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else
    this->ChipManufacturer = UnknownManufacturer; // Unknown manufacturer
}